

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.hh
# Opt level: O0

string * tchecker::parsing::system_declaration_t::location_map_key
                   (string *__return_storage_ptr__,string *process_name,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  string *process_name_local;
  
  local_20 = name;
  name_local = process_name;
  process_name_local = __return_storage_ptr__;
  std::operator+(&local_40,process_name,":");
  std::operator+(__return_storage_ptr__,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline static std::string location_map_key(std::string const & process_name, std::string const & name)
  {
    return (process_name + ":" + name);
  }